

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O1

void __thiscall
Catch::
BinaryExpr<const_(anonymous_namespace)::Constructable_&,_const_(anonymous_namespace)::Constructable_&>
::streamReconstructedExpression
          (BinaryExpr<const_(anonymous_namespace)::Constructable_&,_const_(anonymous_namespace)::Constructable_&>
           *this,ostream *os)

{
  string *in_R9;
  StringRef op;
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 *local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  
  local_28 = 0x7d3f7b;
  local_30 = 3;
  local_48 = 0x7d3f7b;
  local_50 = 3;
  op.m_size = (size_type)&local_58;
  op.m_start = (char *)(this->m_op).m_size;
  local_58 = &local_48;
  local_38 = &local_28;
  formatReconstructedExpression
            ((Catch *)os,(ostream *)&local_38,(string *)(this->m_op).m_start,op,in_R9);
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT44(uStack_44,local_48) + 1);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT44(uStack_24,local_28) + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }